

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cc
# Opt level: O2

uint8_t conv_bin2ascii(uint8_t a)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  
  bVar4 = a & 0x3f;
  bVar1 = 0;
  bVar2 = 0;
  if (bVar4 == 0x3e) {
    bVar2 = 0xff;
  }
  bVar3 = 0;
  if (bVar4 < 0x3e) {
    bVar3 = 0xff;
  }
  bVar2 = bVar2 & 4 ^ 0x2f;
  bVar2 = ((a & 0x3f) - 4 ^ bVar2) & bVar3 ^ bVar2;
  bVar3 = 0;
  if (bVar4 < 0x34) {
    bVar3 = 0xff;
  }
  bVar2 = ((a & 0x3f) + 0x47 ^ bVar2) & bVar3 ^ bVar2;
  if (bVar4 < 0x1a) {
    bVar1 = 0xff;
  }
  return ((a & 0x3f) + 0x41 ^ bVar2) & bVar1 ^ bVar2;
}

Assistant:

static uint8_t conv_bin2ascii(uint8_t a) {
  // Since PEM is sometimes used to carry private keys, we encode base64 data
  // itself in constant-time.
  a &= 0x3f;
  uint8_t ret = constant_time_select_8(constant_time_eq_8(a, 62), '+', '/');
  ret =
      constant_time_select_8(constant_time_lt_args_8(a, 62), a - 52 + '0', ret);
  ret =
      constant_time_select_8(constant_time_lt_args_8(a, 52), a - 26 + 'a', ret);
  ret = constant_time_select_8(constant_time_lt_args_8(a, 26), a + 'A', ret);
  return ret;
}